

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

void __thiscall
llvm::DWARFUnitVector::addUnitsImpl
          (DWARFUnitVector *this,DWARFContext *Context,DWARFObject *Obj,DWARFSection *Section,
          DWARFDebugAbbrev *DA,DWARFSection *RS,DWARFSection *LocSection,StringRef SS,
          DWARFSection *SOS,DWARFSection *AOS,DWARFSection *LS,bool LE,bool IsDWO,bool Lazy,
          DWARFSectionKind SectionKind)

{
  ulong uVar1;
  DWARFUnit *pDVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  iterator puVar5;
  uint64_t uVar6;
  iterator puVar7;
  _Any_data __tmp;
  _Any_data local_58;
  undefined8 local_48;
  _Invoker_type p_Stack_40;
  function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
  *local_38;
  
  uVar1 = (Section->Data).Length;
  local_38 = &this->Parser;
  if ((this->Parser).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_48 = 0;
    p_Stack_40 = (_Invoker_type)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    puVar4 = (undefined8 *)operator_new(0x68);
    *puVar4 = Context;
    puVar4[1] = Obj;
    puVar4[2] = Section;
    puVar4[3] = SOS;
    puVar4[4] = LS;
    *(bool *)(puVar4 + 5) = LE;
    *(bool *)((long)puVar4 + 0x29) = IsDWO;
    puVar4[6] = DA;
    puVar4[7] = RS;
    puVar4[8] = LocSection;
    puVar4[9] = SS.Data;
    puVar4[10] = SS.Length;
    puVar4[0xb] = AOS;
    puVar4[0xc] = this;
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(local_38->super__Function_base)._M_functor;
    uVar3 = *(undefined8 *)((long)&(local_38->super__Function_base)._M_functor + 8);
    *(undefined8 **)&(local_38->super__Function_base)._M_functor = puVar4;
    *(undefined8 *)((long)&(local_38->super__Function_base)._M_functor + 8) = local_58._8_8_;
    local_48 = 0;
    (this->Parser).super__Function_base._M_manager =
         std::
         _Function_handler<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFUnit.cpp:68:14)>
         ::_M_manager;
    p_Stack_40 = (this->Parser)._M_invoker;
    (this->Parser)._M_invoker =
         std::
         _Function_handler<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFUnit.cpp:68:14)>
         ::_M_invoke;
    local_58._8_8_ = uVar3;
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
  }
  if (!Lazy) {
    puVar5 = (iterator)
             (this->
             super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
             ).
             super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
             .
             super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             .
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             .super_SmallVectorBase.BeginX;
    uVar6 = 0;
    puVar7 = puVar5;
    while (uVar6 < uVar1) {
      while ((puVar7 != puVar5 + (this->
                                 super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                                 ).
                                 super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                                 .
                                 super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                                 .
                                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                                 .super_SmallVectorBase.Size &&
             ((pDVar2 = (puVar7->_M_t).
                        super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                        .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,
              pDVar2->InfoSection != Section || ((pDVar2->Header).Offset == uVar6))))) {
        puVar7 = puVar7 + 1;
      }
      std::
      function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
      ::operator()((function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
                    *)&local_58,(unsigned_long)local_38,(DWARFSectionKind)uVar6,
                   (DWARFSection *)(ulong)SectionKind,(Entry *)Section);
      if ((_func_void *)local_58._M_unused._0_8_ == (_func_void *)0x0) {
        return;
      }
      uVar6 = DWARFUnitHeader::getNextUnitOffset
                        ((DWARFUnitHeader *)(local_58._M_unused._M_function_pointer + 0x18));
      puVar7 = SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
               ::insert((SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                         *)this,puVar7,
                        (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                        &local_58);
      if ((_func_void *)local_58._M_unused._0_8_ != (_func_void *)0x0) {
        (**(code **)(*local_58._M_unused._M_object + 8))();
      }
      puVar7 = puVar7 + 1;
      puVar5 = (iterator)
               (this->
               super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
               ).
               super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
               .
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               .
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX;
    }
  }
  return;
}

Assistant:

void DWARFUnitVector::addUnitsImpl(
    DWARFContext &Context, const DWARFObject &Obj, const DWARFSection &Section,
    const DWARFDebugAbbrev *DA, const DWARFSection *RS,
    const DWARFSection *LocSection, StringRef SS, const DWARFSection &SOS,
    const DWARFSection *AOS, const DWARFSection &LS, bool LE, bool IsDWO,
    bool Lazy, DWARFSectionKind SectionKind) {
  DWARFDataExtractor Data(Obj, Section, LE, 0);
  // Lazy initialization of Parser, now that we have all section info.
  if (!Parser) {
    Parser = [=, &Context, &Obj, &Section, &SOS,
              &LS](uint64_t Offset, DWARFSectionKind SectionKind,
                   const DWARFSection *CurSection,
                   const DWARFUnitIndex::Entry *IndexEntry)
        -> std::unique_ptr<DWARFUnit> {
      const DWARFSection &InfoSection = CurSection ? *CurSection : Section;
      DWARFDataExtractor Data(Obj, InfoSection, LE, 0);
      if (!Data.isValidOffset(Offset))
        return nullptr;
      const DWARFUnitIndex *Index = nullptr;
      if (IsDWO)
        Index = &getDWARFUnitIndex(Context, SectionKind);
      DWARFUnitHeader Header;
      if (!Header.extract(Context, Data, &Offset, SectionKind, Index,
                          IndexEntry))
        return nullptr;
      std::unique_ptr<DWARFUnit> U;
      if (Header.isTypeUnit())
        U = std::make_unique<DWARFTypeUnit>(Context, InfoSection, Header, DA,
                                             RS, LocSection, SS, SOS, AOS, LS,
                                             LE, IsDWO, *this);
      else
        U = std::make_unique<DWARFCompileUnit>(Context, InfoSection, Header,
                                                DA, RS, LocSection, SS, SOS,
                                                AOS, LS, LE, IsDWO, *this);
      return U;
    };
  }
  if (Lazy)
    return;
  // Find a reasonable insertion point within the vector.  We skip over
  // (a) units from a different section, (b) units from the same section
  // but with lower offset-within-section.  This keeps units in order
  // within a section, although not necessarily within the object file,
  // even if we do lazy parsing.
  auto I = this->begin();
  uint64_t Offset = 0;
  while (Data.isValidOffset(Offset)) {
    if (I != this->end() &&
        (&(*I)->getInfoSection() != &Section || (*I)->getOffset() == Offset)) {
      ++I;
      continue;
    }
    auto U = Parser(Offset, SectionKind, &Section, nullptr);
    // If parsing failed, we're done with this section.
    if (!U)
      break;
    Offset = U->getNextUnitOffset();
    I = std::next(this->insert(I, std::move(U)));
  }
}